

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall CTcTokenizer::is_tok_safe(CTcTokenizer *this,tc_toktyp_t typ)

{
  if (((TOKT_RESTR < typ) || ((0x7fd00U >> (typ & TOKT_MINUS) & 1) == 0)) && (1 < typ - TOKT_FLOAT))
  {
    return 0;
  }
  return 1;
}

Assistant:

int CTcTokenizer::is_tok_safe(tc_toktyp_t typ)
{
    switch (typ)
    {
    case TOKT_SYM:
    case TOKT_SSTR:
    case TOKT_SSTR_START:
    case TOKT_SSTR_MID:
    case TOKT_SSTR_END:
    case TOKT_DSTR:
    case TOKT_DSTR_START:
    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_RESTR:
    case TOKT_FLOAT:
    case TOKT_BIGINT:
        /* these types are always stored in the source list */
        return TRUE;

    default:
        /* other types are not always safely stored */
        return FALSE;
    }
}